

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  unsigned_short *__src;
  ImDrawChannel *pIVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ulong uVar10;
  ImDrawCmd *pIVar11;
  long lVar12;
  ImDrawCmd *pIVar13;
  long lVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  unsigned_short *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar17 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  iVar16 = 0;
  if (0 < this->_Count) {
    lVar14 = (long)(draw_list->CmdBuffer).Size;
    iVar17 = 0;
    if (lVar14 < 1) {
LAB_001309c2:
      pIVar11 = (ImDrawCmd *)0x0;
      uVar21 = 0;
    }
    else {
      pIVar13 = (draw_list->CmdBuffer).Data;
      pIVar11 = pIVar13 + lVar14 + -1;
      if (pIVar11 == (ImDrawCmd *)0x0) goto LAB_001309c2;
      uVar21 = pIVar13[lVar14 + -1].ElemCount + pIVar13[lVar14 + -1].IdxOffset;
    }
    if (this->_Count != 1) {
      iVar16 = 0;
      lVar14 = 1;
      iVar17 = 0;
      do {
        if ((this->_Channels).Size <= lVar14) goto LAB_00130d42;
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar14;
        iVar19 = pIVar2[lVar14]._CmdBuffer.Size;
        uVar10 = (ulong)iVar19;
        if ((long)uVar10 < 1) {
LAB_00130abf:
          iVar18 = (pIVar3->_IdxBuffer).Size;
        }
        else {
          if ((pIVar3->_CmdBuffer).Data[uVar10 - 1].ElemCount == 0) {
            uVar10 = (ulong)(iVar19 - 1U);
            (pIVar3->_CmdBuffer).Size = iVar19 - 1U;
          }
          if (((int)uVar10 == 0) || (pIVar11 == (ImDrawCmd *)0x0)) {
LAB_00130a8f:
            iVar19 = (int)uVar10;
            if (iVar19 < 1) goto LAB_00130abf;
          }
          else {
            pIVar13 = (pIVar3->_CmdBuffer).Data;
            auVar24[0] = -(*(char *)&(pIVar13->ClipRect).x == *(char *)&(pIVar11->ClipRect).x);
            auVar24[1] = -(*(char *)((long)&(pIVar13->ClipRect).x + 1) ==
                          *(char *)((long)&(pIVar11->ClipRect).x + 1));
            auVar24[2] = -(*(char *)((long)&(pIVar13->ClipRect).x + 2) ==
                          *(char *)((long)&(pIVar11->ClipRect).x + 2));
            auVar24[3] = -(*(char *)((long)&(pIVar13->ClipRect).x + 3) ==
                          *(char *)((long)&(pIVar11->ClipRect).x + 3));
            auVar24[4] = -(*(char *)&(pIVar13->ClipRect).y == *(char *)&(pIVar11->ClipRect).y);
            auVar24[5] = -(*(char *)((long)&(pIVar13->ClipRect).y + 1) ==
                          *(char *)((long)&(pIVar11->ClipRect).y + 1));
            auVar24[6] = -(*(char *)((long)&(pIVar13->ClipRect).y + 2) ==
                          *(char *)((long)&(pIVar11->ClipRect).y + 2));
            auVar24[7] = -(*(char *)((long)&(pIVar13->ClipRect).y + 3) ==
                          *(char *)((long)&(pIVar11->ClipRect).y + 3));
            auVar24[8] = -(*(char *)&(pIVar13->ClipRect).z == *(char *)&(pIVar11->ClipRect).z);
            auVar24[9] = -(*(char *)((long)&(pIVar13->ClipRect).z + 1) ==
                          *(char *)((long)&(pIVar11->ClipRect).z + 1));
            auVar24[10] = -(*(char *)((long)&(pIVar13->ClipRect).z + 2) ==
                           *(char *)((long)&(pIVar11->ClipRect).z + 2));
            auVar24[0xb] = -(*(char *)((long)&(pIVar13->ClipRect).z + 3) ==
                            *(char *)((long)&(pIVar11->ClipRect).z + 3));
            auVar24[0xc] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar11->ClipRect).w);
            auVar24[0xd] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                            *(char *)((long)&(pIVar11->ClipRect).w + 1));
            auVar24[0xe] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                            *(char *)((long)&(pIVar11->ClipRect).w + 2));
            auVar24[0xf] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                            *(char *)((long)&(pIVar11->ClipRect).w + 3));
            auVar22[0] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar11->ClipRect).w);
            auVar22[1] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar11->ClipRect).w + 1));
            auVar22[2] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar11->ClipRect).w + 2));
            auVar22[3] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar11->ClipRect).w + 3));
            auVar22[4] = -(*(char *)&pIVar13->TextureId == *(char *)&pIVar11->TextureId);
            auVar22[5] = -(*(char *)((long)&pIVar13->TextureId + 1) ==
                          *(char *)((long)&pIVar11->TextureId + 1));
            auVar22[6] = -(*(char *)((long)&pIVar13->TextureId + 2) ==
                          *(char *)((long)&pIVar11->TextureId + 2));
            auVar22[7] = -(*(char *)((long)&pIVar13->TextureId + 3) ==
                          *(char *)((long)&pIVar11->TextureId + 3));
            auVar22[8] = -(*(char *)((long)&pIVar13->TextureId + 4) ==
                          *(char *)((long)&pIVar11->TextureId + 4));
            auVar22[9] = -(*(char *)((long)&pIVar13->TextureId + 5) ==
                          *(char *)((long)&pIVar11->TextureId + 5));
            auVar22[10] = -(*(char *)((long)&pIVar13->TextureId + 6) ==
                           *(char *)((long)&pIVar11->TextureId + 6));
            auVar22[0xb] = -(*(char *)((long)&pIVar13->TextureId + 7) ==
                            *(char *)((long)&pIVar11->TextureId + 7));
            auVar22[0xc] = -((char)pIVar13->VtxOffset == (char)pIVar11->VtxOffset);
            auVar22[0xd] = -(*(char *)((long)&pIVar13->VtxOffset + 1) ==
                            *(char *)((long)&pIVar11->VtxOffset + 1));
            auVar22[0xe] = -(*(char *)((long)&pIVar13->VtxOffset + 2) ==
                            *(char *)((long)&pIVar11->VtxOffset + 2));
            auVar22[0xf] = -(*(char *)((long)&pIVar13->VtxOffset + 3) ==
                            *(char *)((long)&pIVar11->VtxOffset + 3));
            auVar22 = auVar22 & auVar24;
            if (((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) &&
               (pIVar13->UserCallback == (ImDrawCallback)0x0 &&
                pIVar11->UserCallback == (ImDrawCallback)0x0)) {
              pIVar11->ElemCount = pIVar11->ElemCount + pIVar13->ElemCount;
              uVar21 = uVar21 + pIVar13->ElemCount;
              memmove(pIVar13,pIVar13 + 1,(uVar10 & 0xffffffff) * 0x38 - 0x38);
              uVar9 = (pIVar3->_CmdBuffer).Size - 1;
              uVar10 = (ulong)uVar9;
              (pIVar3->_CmdBuffer).Size = uVar9;
              goto LAB_00130a8f;
            }
          }
          pIVar13 = (pIVar3->_CmdBuffer).Data;
          iVar19 = (int)uVar10;
          uVar10 = uVar10 & 0xffffffff;
          pIVar11 = pIVar13 + (uVar10 - 1);
          iVar18 = (pIVar3->_IdxBuffer).Size;
          puVar15 = &pIVar13->ElemCount;
          do {
            puVar15[-1] = uVar21;
            uVar21 = uVar21 + *puVar15;
            puVar15 = puVar15 + 0xe;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        iVar17 = iVar17 + iVar18;
        iVar16 = iVar16 + iVar19;
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->_Count);
    }
  }
  uVar21 = (draw_list->CmdBuffer).Size + iVar16;
  iVar19 = (draw_list->CmdBuffer).Capacity;
  if (iVar19 < (int)uVar21) {
    if (iVar19 == 0) {
      uVar9 = 8;
    }
    else {
      uVar9 = iVar19 / 2 + iVar19;
    }
    if ((int)uVar9 <= (int)uVar21) {
      uVar9 = uVar21;
    }
    pIVar11 = (ImDrawCmd *)ImGui::MemAlloc((long)(int)uVar9 * 0x38);
    pIVar13 = (draw_list->CmdBuffer).Data;
    if (pIVar13 != (ImDrawCmd *)0x0) {
      memcpy(pIVar11,pIVar13,(long)(draw_list->CmdBuffer).Size * 0x38);
      ImGui::MemFree((draw_list->CmdBuffer).Data);
    }
    (draw_list->CmdBuffer).Data = pIVar11;
    (draw_list->CmdBuffer).Capacity = uVar9;
  }
  (draw_list->CmdBuffer).Size = uVar21;
  lVar14 = (long)(draw_list->IdxBuffer).Size + (long)iVar17;
  iVar19 = (draw_list->IdxBuffer).Capacity;
  iVar18 = (int)lVar14;
  if (iVar19 < iVar18) {
    if (iVar19 == 0) {
      iVar19 = 8;
    }
    else {
      iVar19 = iVar19 / 2 + iVar19;
    }
    if (iVar19 <= iVar18) {
      iVar19 = iVar18;
    }
    local_40 = (unsigned_short *)ImGui::MemAlloc((long)iVar19 * 2);
    __src = (draw_list->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(local_40,__src,(long)(draw_list->IdxBuffer).Size * 2);
      ImGui::MemFree((draw_list->IdxBuffer).Data);
    }
    (draw_list->IdxBuffer).Data = local_40;
    (draw_list->IdxBuffer).Capacity = iVar19;
    uVar21 = (draw_list->CmdBuffer).Size;
  }
  else {
    local_40 = (draw_list->IdxBuffer).Data;
  }
  (draw_list->IdxBuffer).Size = iVar18;
  local_40 = local_40 + (lVar14 - iVar17);
  if (1 < this->_Count) {
    pIVar13 = (draw_list->CmdBuffer).Data + ((long)(int)uVar21 - (long)iVar16);
    lVar20 = 1;
    lVar14 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar20) {
LAB_00130d42:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar3 = (this->_Channels).Data;
      lVar12 = (long)*(int *)((long)pIVar3 + lVar14 + -0x18);
      if (lVar12 != 0) {
        memcpy(pIVar13,*(void **)((long)pIVar3 + lVar14 + -0x10),lVar12 * 0x38);
        pIVar13 = pIVar13 + lVar12;
      }
      lVar12 = (long)*(int *)((long)pIVar3 + lVar14 + -8);
      if (lVar12 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar14),lVar12 * 2);
        local_40 = local_40 + lVar12;
      }
      lVar20 = lVar20 + 1;
      lVar14 = lVar14 + 0x20;
    } while (lVar20 < this->_Count);
    uVar21 = (draw_list->CmdBuffer).Size;
  }
  draw_list->_IdxWritePtr = local_40;
  if (uVar21 != 0) {
    if ((int)uVar21 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x695,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar13 = (draw_list->CmdBuffer).Data;
    if (pIVar13[(ulong)uVar21 - 1].UserCallback == (ImDrawCallback)0x0) goto LAB_00130ccc;
  }
  ImDrawList::AddDrawCmd(draw_list);
  pIVar13 = (draw_list->CmdBuffer).Data;
  uVar21 = (draw_list->CmdBuffer).Size;
LAB_00130ccc:
  pIVar11 = pIVar13 + (long)(int)uVar21 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar13[(long)(int)uVar21 + -1].ElemCount == 0) {
    fVar5 = (pIVar1->ClipRect).x;
    fVar6 = (pIVar1->ClipRect).y;
    fVar7 = (draw_list->_CmdHeader).ClipRect.z;
    fVar8 = (draw_list->_CmdHeader).ClipRect.w;
    uVar4 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 4) = uVar4;
    (pIVar11->ClipRect).x = fVar5;
    (pIVar11->ClipRect).y = fVar6;
    pIVar13[(long)(int)uVar21 + -1].ClipRect.z = fVar7;
    pIVar13[(long)(int)uVar21 + -1].ClipRect.w = fVar8;
  }
  else {
    auVar25[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar11->ClipRect).x);
    auVar25[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.x + 1));
    auVar25[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.x + 2));
    auVar25[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.x + 3));
    auVar25[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar13[(long)(int)uVar21 + -1].ClipRect.y);
    auVar25[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.y + 1));
    auVar25[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.y + 2));
    auVar25[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.y + 3));
    auVar25[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar13[(long)(int)uVar21 + -1].ClipRect.z);
    auVar25[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.z + 1));
    auVar25[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.z + 2));
    auVar25[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.z + 3));
    auVar25[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w);
    auVar25[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 1));
    auVar25[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 2));
    auVar25[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 3));
    auVar23[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w);
    auVar23[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 1));
    auVar23[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 2));
    auVar23[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].ClipRect.w + 3));
    auVar23[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar13[(long)(int)uVar21 + -1].TextureId);
    auVar23[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 1));
    auVar23[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 2));
    auVar23[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 3));
    auVar23[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 4));
    auVar23[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 5));
    auVar23[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 6));
    auVar23[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].TextureId + 7));
    auVar23[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                    (char)pIVar13[(long)(int)uVar21 + -1].VtxOffset);
    auVar23[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].VtxOffset + 1));
    auVar23[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].VtxOffset + 2));
    auVar23[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar13[(long)(int)uVar21 + -1].VtxOffset + 3));
    auVar23 = auVar23 & auVar25;
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}